

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddAuto.c
# Opt level: O0

DdNode * Extra_bddSpaceCanonVars(DdManager *dd,DdNode *bSpace)

{
  DdNode *pDVar1;
  DdNode *bRes;
  DdNode *bSpace_local;
  DdManager *dd_local;
  
  do {
    dd->reordered = 0;
    pDVar1 = extraBddSpaceCanonVars(dd,bSpace);
  } while (dd->reordered == 1);
  return pDVar1;
}

Assistant:

DdNode * Extra_bddSpaceCanonVars( DdManager * dd, DdNode * bSpace )
{
    DdNode * bRes;
    do {
        dd->reordered = 0;
        bRes = extraBddSpaceCanonVars( dd, bSpace );
    } while (dd->reordered == 1);
    return bRes;
}